

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O3

void btreeblk_write_done(void *voidhandle,bid_t bid)

{
  btreeblk_block *block;
  list_elem *plVar1;
  int iVar2;
  fdb_status fVar3;
  list_elem *plVar4;
  list_elem *e;
  
  if (*(list_elem **)((long)voidhandle + 0x18) != (list_elem *)0x0) {
    e = *(list_elem **)((long)voidhandle + 0x18);
    do {
      if (e[-2].prev == (list_elem *)bid) {
        block = (btreeblk_block *)(e + -2);
        iVar2 = filemgr_is_writable(*(filemgr **)((long)voidhandle + 0x38),bid);
        if (iVar2 == 0) {
          fdb_log_impl((err_log_callback *)0x0,1,FDB_RESULT_WRITE_FAIL,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/btreeblock.cc"
                       ,"btreeblk_write_done",0x3cb,"b+tree node write fail, BID %zu, file %s",
                       block->bid,**(undefined8 **)((long)voidhandle + 0x38));
          return;
        }
        fVar3 = _btreeblk_write_dirty_block((btreeblk_handle *)voidhandle,block);
        if (fVar3 != FDB_RESULT_SUCCESS) {
          return;
        }
        plVar4 = list_remove((list *)((long)voidhandle + 0x18),e);
        plVar1 = e[2].next;
        if (plVar1 != (list_elem *)0x0) {
          plVar1->prev = e[-1].next;
          list_push_front((list *)((long)voidhandle + 0x48),(list_elem *)&plVar1->next);
        }
        free(block);
      }
      else {
        plVar4 = e->next;
      }
      e = plVar4;
    } while (plVar4 != (list_elem *)0x0);
  }
  return;
}

Assistant:

void btreeblk_write_done(void* voidhandle, bid_t bid) {
    // flush and write the block for given BID in the allocation list.
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;

    // write and free items in allocation list
    struct list_elem *e = list_begin(&handle->alc_list);
    while (e) {
        struct btreeblk_block *block = _get_entry(e, struct btreeblk_block, le);
        if (block->bid != bid) {
            e = list_next(e);
            continue;
        }
        int writable = filemgr_is_writable(handle->file, block->bid);
        if (writable) {
            fdb_status status = _btreeblk_write_dirty_block(handle, block);
            if (status != FDB_RESULT_SUCCESS) {
                return;
            }
        } else {
            fdb_log(nullptr, FDB_LOG_FATAL,
                    FDB_RESULT_WRITE_FAIL,
                    "b+tree node write fail, BID %zu, file %s",
                    block->bid,
                    handle->file->filename);
            return;
        }

        e = list_remove(&handle->alc_list, &block->le);
        _btreeblk_free_dirty_block(handle, block);
    }
}